

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O2

RC __thiscall
SM_Manager::FindAttr
          (SM_Manager *this,char *relName,char *attrName,RM_Record *attrRec,AttrCatEntry **entry)

{
  RC RVar1;
  RC RVar2;
  int iVar3;
  RC RVar4;
  RelCatEntry *rEntry;
  RM_Record relRec;
  SM_AttrIterator attrIt;
  
  RM_Record::RM_Record(&relRec);
  RVar1 = GetRelEntry(this,relName,&relRec,&rEntry);
  if (RVar1 == 0) {
    SM_AttrIterator::SM_AttrIterator(&attrIt);
    RVar1 = SM_AttrIterator::OpenIterator(&attrIt,&this->attrcatFH,relName);
    if (RVar1 == 0) {
      do {
        RVar2 = SM_AttrIterator::GetNextAttr(&attrIt,attrRec,entry);
        if (RVar2 == 0x6e) break;
        iVar3 = strncmp((*entry)->attrName,attrName,0x19);
      } while (iVar3 != 0);
      RVar4 = SM_AttrIterator::CloseIterator(&attrIt);
      RVar1 = 0x131;
      if (RVar2 != 0x6e) {
        RVar1 = 0;
      }
      if (RVar4 != 0) {
        RVar1 = RVar4;
      }
    }
    SM_AttrIterator::~SM_AttrIterator(&attrIt);
  }
  RM_Record::~RM_Record(&relRec);
  return RVar1;
}

Assistant:

RC SM_Manager::FindAttr(const char *relName, const char *attrName, RM_Record &attrRec, AttrCatEntry *&entry){
  RC rc = 0;
  RM_Record relRec;
  RelCatEntry * rEntry;
  if((rc = GetRelEntry(relName, relRec, rEntry))) // get the relation
    return (rc);
  
  // Iterate through attrcat for attributes in this relation
  SM_AttrIterator attrIt;
  if((rc = attrIt.OpenIterator(attrcatFH, const_cast<char*>(relName))))
    return (rc);
  bool notFound = true;
  while(notFound){
    if((RM_EOF == attrIt.GetNextAttr(attrRec, entry))){
      break;
    }
    // Check if the attribute names match
    if(strncmp(entry->attrName, attrName, MAXNAME + 1) == 0){
      notFound = false;
      break;
    }
  }
  if((rc = attrIt.CloseIterator())) // Done with search!
    return (rc);

  if(notFound == true)  // If attribute is not found, return error
    return (SM_INVALIDATTR);
  return (rc);

}